

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linux-core.c
# Opt level: O2

int uv_uptime(double *uptime)

{
  int iVar1;
  int *piVar2;
  timespec now;
  char buf [128];
  
  iVar1 = uv__slurp("/proc/uptime",buf,0x80);
  if ((iVar1 == 0) && (iVar1 = __isoc99_sscanf(buf,"%lf",uptime), iVar1 == 1)) {
    return 0;
  }
  if (uv_uptime::no_clock_boottime == 0) {
    iVar1 = clock_gettime(7,(timespec *)&now);
    if (iVar1 == 0) goto LAB_0021515e;
    piVar2 = __errno_location();
    if (*piVar2 != 0x16) goto LAB_00215158;
    uv_uptime::no_clock_boottime = 1;
  }
  iVar1 = clock_gettime(1,(timespec *)&now);
  if (iVar1 != 0) {
    piVar2 = __errno_location();
LAB_00215158:
    return -*piVar2;
  }
LAB_0021515e:
  *uptime = (double)now.tv_sec;
  return 0;
}

Assistant:

int uv_uptime(double* uptime) {
  static volatile int no_clock_boottime;
  char buf[128];
  struct timespec now;
  int r;

  /* Try /proc/uptime first, then fallback to clock_gettime(). */

  if (0 == uv__slurp("/proc/uptime", buf, sizeof(buf)))
    if (1 == sscanf(buf, "%lf", uptime))
      return 0;

  /* Try CLOCK_BOOTTIME first, fall back to CLOCK_MONOTONIC if not available
   * (pre-2.6.39 kernels). CLOCK_MONOTONIC doesn't increase when the system
   * is suspended.
   */
  if (no_clock_boottime) {
    retry_clock_gettime: r = clock_gettime(CLOCK_MONOTONIC, &now);
  }
  else if ((r = clock_gettime(CLOCK_BOOTTIME, &now)) && errno == EINVAL) {
    no_clock_boottime = 1;
    goto retry_clock_gettime;
  }

  if (r)
    return UV__ERR(errno);

  *uptime = now.tv_sec;
  return 0;
}